

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O0

void __thiscall
Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::reserve
          (Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *this,
          size_t capacity)

{
  MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> *pMVar1;
  MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> *this_00;
  MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> *pMVar2;
  ulong in_RSI;
  Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *in_RDI;
  uint i;
  MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> *mem;
  size_t in_stack_ffffffffffffffd0;
  uint local_1c;
  
  if (in_RDI->_capacity < in_RSI) {
    pMVar1 = (MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
             Lib::alloc(in_stack_ffffffffffffffd0);
    if (in_RDI->_stack == (MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x0) {
      in_RDI->_stack = pMVar1;
      in_RDI->_cursor = pMVar1;
      in_RDI->_capacity = in_RSI;
      in_RDI->_end = in_RDI->_stack + in_RDI->_capacity;
    }
    else {
      local_1c = 0;
      while( true ) {
        this_00 = (MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)(ulong)local_1c;
        pMVar2 = (MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)size(in_RDI);
        if (pMVar2 <= this_00) break;
        pMVar2 = pMVar1 + local_1c;
        operator[](in_RDI,(ulong)local_1c);
        Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>::MonomFactor
                  (this_00,pMVar2);
        local_1c = local_1c + 1;
      }
      Lib::free(in_RDI->_stack);
      in_RDI->_cursor = pMVar1 + ((long)in_RDI->_cursor - (long)in_RDI->_stack) / 0x1c;
      in_RDI->_capacity = in_RSI;
      in_RDI->_stack = pMVar1;
      in_RDI->_end = in_RDI->_stack + in_RDI->_capacity;
    }
  }
  return;
}

Assistant:

inline
  void reserve(size_t capacity) 
  {
    if (_capacity >= capacity) {
      return;
    }
    C* mem = static_cast<C*>(ALLOC_KNOWN(capacity*sizeof(C),className()));
    if (_stack) {
      for (unsigned i = 0; i < size(); i++) {
        ::new(&mem[i]) C(std::move((*this)[i]));
      }
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());

      _cursor = mem + (_cursor - _stack);
      _capacity = capacity;
      _stack = mem;
      _end = _stack + _capacity;
    } else {
      _stack = mem;
      _cursor = mem;
      _capacity = capacity;
      _end = _stack + _capacity;
    }
  }